

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  Result RVar1;
  undefined1 local_e0 [8];
  BinaryWriterSpec binary_writer_spec;
  code *local_48;
  
  std::function<wabt::Stream_*(wabt::string_view)>::function
            ((function<wabt::Stream_*(wabt::string_view)> *)&binary_writer_spec.num_modules_,
             module_stream_factory);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_e0,json_stream,
             (WriteBinarySpecStreamFactory *)&binary_writer_spec.num_modules_,source_filename,
             module_filename_noext,options);
  if (local_48 != (code *)0x0) {
    (*local_48)((_Any_data *)&binary_writer_spec.num_modules_,
                (_Any_data *)&binary_writer_spec.num_modules_,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript((BinaryWriterSpec *)local_e0,script);
  if ((size_type *)binary_writer_spec.source_filename_.field_2._8_8_ !=
      &binary_writer_spec.module_filename_noext_._M_string_length) {
    operator_delete((void *)binary_writer_spec.source_filename_.field_2._8_8_);
  }
  if (binary_writer_spec.module_stream_factory_._M_invoker !=
      (_Invoker_type)&binary_writer_spec.source_filename_._M_string_length) {
    operator_delete(binary_writer_spec.module_stream_factory_._M_invoker);
  }
  if (binary_writer_spec.module_stream_factory_.super__Function_base._M_functor._8_8_ != 0) {
    (*(code *)binary_writer_spec.module_stream_factory_.super__Function_base._M_functor._8_8_)
              (&binary_writer_spec.json_stream_,&binary_writer_spec.json_stream_,3);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             string_view source_filename,
                             string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}